

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void spiderMode(Problem *problem)

{
  Exception *e;
  ScopedPtr<Kernel::Problem> prb;
  bool exceptionRaised;
  Exception *exception;
  Problem *in_stack_ffffffffffffff98;
  ScopedPtr<Kernel::Problem> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  ScopedPtr<Kernel::Problem> local_20;
  byte local_11;
  undefined8 local_10;
  
  Shell::Options::setBadOptionChoice(Lib::env,HARD);
  uVar1 = 1;
  Shell::Options::setOutputMode(Lib::env,SPIDER);
  Shell::Options::setNormalize(Lib::env,SUB41(uVar1,0));
  local_10 = 0;
  local_11 = 0;
  Lib::ScopedPtr<Kernel::Problem>::ScopedPtr(&local_20);
  doProving((Problem *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  Lib::ScopedPtr<Kernel::Problem>::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((local_11 & 1) == 0) {
    (*(code *)(&DAT_00e50004 + *(int *)(&DAT_00e50004 + (ulong)*(uint *)(DAT_01333840 + 0x224) * 4))
    )();
    return;
  }
  vampireReturnValue = 4;
  Shell::reportSpiderFail();
  explainException((Exception *)0x184eb0);
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void spiderMode(Problem* problem)
{
  env.options->setBadOptionChoice(Options::BadOption::HARD);
  env.options->setOutputMode(Options::Output::SPIDER);
  env.options->setNormalize(true);

  Exception* exception = 0;
#if VZ3
  z3::exception* z3_exception = 0;
#endif

  bool exceptionRaised = false;
  ScopedPtr<Problem> prb;
  try {
    prb = doProving(problem);
  } catch (Exception& e) {
    exception = &e;
    exceptionRaised = true;
#if VZ3
  } catch(z3::exception& e){
    z3_exception = &e;
    exceptionRaised = true;
#endif
  } catch (...) {
    exceptionRaised = true;
  }

  if (!exceptionRaised) {
    switch (env.statistics->terminationReason) {
    case TerminationReason::REFUTATION:
      reportSpiderStatus('+');
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
      break;
    case TerminationReason::TIME_LIMIT:
      reportSpiderStatus('t');
      break;
    case TerminationReason::MEMORY_LIMIT:
      reportSpiderStatus('m');
      break;
    case TerminationReason::UNKNOWN:
    case TerminationReason::INAPPROPRIATE:
      reportSpiderStatus('u');
      break;
    case TerminationReason::REFUTATION_NOT_FOUND:
      if (env.statistics->discardedNonRedundantClauses > 0) {
        reportSpiderStatus('n');
      }
      else{
        reportSpiderStatus('i');
      }
      break;
    case TerminationReason::SATISFIABLE:
      reportSpiderStatus('-');
      vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
      break;
    default:
      ASSERTION_VIOLATION;
    }
    return;
  }

  // exception
  vampireReturnValue = VAMP_RESULT_STATUS_UNHANDLED_EXCEPTION;

#if VZ3
  if (z3_exception) {
    if (strcmp(z3_exception->msg(),"out of memory\n")) {
      reportSpiderStatus('m');
    }
    else {
      reportSpiderFail();
    }

    return;
  }
#endif

  reportSpiderFail();

  ASS(exception);
  explainException(*exception);
}